

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O1

void CheckScriptKeyboardAccessible(TidyDocImpl *doc,Node *node)

{
  Attribute *pAVar1;
  uint uVar2;
  int iVar3;
  AttVal *pAVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Node *node_00;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  
  if (((doc->access).PRIORITYCHK & 0xfffffffeU) == 2) {
    pAVar4 = node->attributes;
    uVar2 = 0;
    if (pAVar4 == (AttVal *)0x0) {
      bVar9 = false;
      bVar10 = false;
      bVar11 = false;
      bVar12 = false;
      bVar13 = false;
    }
    else {
      iVar3 = 0;
      iVar5 = 0;
      iVar6 = 0;
      iVar7 = 0;
      iVar8 = 0;
      do {
        pAVar1 = pAVar4->dict;
        if (pAVar1 != (Attribute *)0x0) {
          iVar3 = iVar3 + (uint)(pAVar1->id == TidyAttr_OnMOUSEOVER);
          uVar2 = uVar2 + (pAVar1->id == TidyAttr_OnMOUSEMOVE);
          iVar8 = iVar8 + (uint)(pAVar1->id == TidyAttr_OnMOUSEDOWN) +
                  (uint)(pAVar1->id == TidyAttr_OnKEYDOWN);
          iVar7 = iVar7 + (uint)(pAVar1->id == TidyAttr_OnMOUSEUP) +
                  (uint)(pAVar1->id == TidyAttr_OnKEYUP);
          iVar6 = iVar6 + (uint)(pAVar1->id == TidyAttr_OnCLICK) +
                  (uint)(pAVar1->id == TidyAttr_OnKEYPRESS);
          iVar5 = iVar5 + (uint)(pAVar1->id == TidyAttr_OnMOUSEOUT) +
                  (uint)(pAVar1->id == TidyAttr_OnBLUR);
        }
        pAVar4 = pAVar4->next;
      } while (pAVar4 != (AttVal *)0x0);
      bVar9 = iVar7 == 1;
      bVar10 = iVar6 == 1;
      bVar11 = iVar5 == 1;
      bVar12 = iVar3 == 1;
      bVar13 = uVar2 == 1;
      uVar2 = (uint)(iVar8 == 1);
    }
    if ((char)uVar2 != '\0') {
      prvTidyReportAccessError(doc,node,0x2ec);
    }
    if (bVar9) {
      prvTidyReportAccessError(doc,node,0x2ed);
    }
    if (bVar10) {
      prvTidyReportAccessError(doc,node,0x2ee);
    }
    if (bVar11) {
      prvTidyReportAccessError(doc,node,0x2f0);
    }
    if (bVar12) {
      prvTidyReportAccessError(doc,node,0x2ef);
    }
    if (bVar13) {
      prvTidyReportAccessError(doc,node,0x2f1);
    }
    for (node_00 = node->content; node_00 != (Node *)0x0; node_00 = node_00->next) {
      CheckScriptKeyboardAccessible(doc,node_00);
    }
  }
  return;
}

Assistant:

static void CheckScriptKeyboardAccessible( TidyDocImpl* doc, Node* node )
{
    Node* content;
    int HasOnMouseDown = 0;
    int HasOnMouseUp = 0;
    int HasOnClick = 0;
    int HasOnMouseOut = 0;
    int HasOnMouseOver = 0;
    int HasOnMouseMove = 0;

    if (Level2_Enabled( doc ))
    {
        AttVal* av;
        /* Checks all elements for their attributes */
        for (av = node->attributes; av != NULL; av = av->next)
        {
            /* Must also have 'ONKEYDOWN' attribute with 'ONMOUSEDOWN' */
            if ( attrIsOnMOUSEDOWN(av) )
                HasOnMouseDown++;

            /* Must also have 'ONKEYUP' attribute with 'ONMOUSEUP' */
            if ( attrIsOnMOUSEUP(av) )
                HasOnMouseUp++;

            /* Must also have 'ONKEYPRESS' attribute with 'ONCLICK' */
            if ( attrIsOnCLICK(av) )
                HasOnClick++;

            /* Must also have 'ONBLUR' attribute with 'ONMOUSEOUT' */
            if ( attrIsOnMOUSEOUT(av) )
                HasOnMouseOut++;

            if ( attrIsOnMOUSEOVER(av) )
                HasOnMouseOver++;

            if ( attrIsOnMOUSEMOVE(av) )
                HasOnMouseMove++;

            if ( attrIsOnKEYDOWN(av) )
                HasOnMouseDown++;

            if ( attrIsOnKEYUP(av) )
                HasOnMouseUp++;

            if ( attrIsOnKEYPRESS(av) )
                HasOnClick++;

            if ( attrIsOnBLUR(av) )
                HasOnMouseOut++;
        }

        if ( HasOnMouseDown == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_DOWN);

        if ( HasOnMouseUp == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_UP);

        if ( HasOnClick == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_CLICK);
        if ( HasOnMouseOut == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_OUT);

        if ( HasOnMouseOver == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_OVER);

        if ( HasOnMouseMove == 1 )
            TY_(ReportAccessError)( doc, node, SCRIPT_NOT_KEYBOARD_ACCESSIBLE_ON_MOUSE_MOVE);

        /* Recursively check all child nodes.
         */
        for ( content = node->content; content != NULL; content = content->next )
            CheckScriptKeyboardAccessible( doc, content );
    }
}